

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O2

int __thiscall
FIX::DataDictionary::lookupXMLFieldNumber(DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  ConfigError *this_00;
  string *pDoc_00;
  allocator<char> local_61;
  long *local_60;
  string local_58;
  string name;
  
  (*pNode->_vptr_DOMNode[4])(&local_60,pNode);
  plVar1 = local_60;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"name",&local_61);
  pDoc_00 = &local_58;
  cVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,pDoc_00,&name);
  std::__cxx11::string::~string((string *)&local_58);
  if (cVar2 != '\0') {
    iVar3 = lookupXMLFieldNumber(this,(DOMDocument *)pDoc_00,&name);
    std::__cxx11::string::~string((string *)&name);
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
    return iVar3;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"No name given to field",&local_61);
  ConfigError::ConfigError(this_00,&local_58);
  __cxa_throw(this_00,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

int DataDictionary::lookupXMLFieldNumber(DOMDocument *pDoc, DOMNode *pNode) const {
  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if (!attrs->get("name", name)) {
    throw ConfigError("No name given to field");
  }
  return lookupXMLFieldNumber(pDoc, name);
}